

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  int iVar2;
  ImGuiTabBar *pIVar3;
  
  iVar1 = this->FreeIdx;
  if (iVar1 == (this->Data).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Data,iVar1 + 1);
    iVar2 = this->FreeIdx + 1;
    pIVar3 = (this->Data).Data;
  }
  else {
    pIVar3 = (this->Data).Data;
    iVar2 = pIVar3[iVar1].Tabs.Size;
  }
  this->FreeIdx = iVar2;
  ImGuiTabBar::ImGuiTabBar(pIVar3 + iVar1);
  return (this->Data).Data + iVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }